

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPUtils.cpp
# Opt level: O1

bool net_uv::kcp_grab_syn_and_ack_value(char *data,uint32_t len,uint32_t *pValue,uint32_t *pConv)

{
  _Alloc_hider _Var1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  char *in_R8;
  bool bVar6;
  char *__s;
  string str;
  long *local_68;
  long local_60;
  long local_58 [2];
  string local_48;
  
  if (pValue != (uint32_t *)0x0) {
    *pValue = 0;
  }
  if (pConv != (uint32_t *)0x0) {
    *pConv = 0;
  }
  get_kcp_packet_info_abi_cxx11_(&local_48,(net_uv *)data,(char *)(ulong)len,0x159233,in_R8);
  if (local_48._M_string_length == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = false;
    lVar3 = std::__cxx11::string::find((char *)&local_48,0x159247,0);
    lVar4 = std::__cxx11::string::find((char *)&local_48,0x15924f,0);
    if (7 < lVar4 + 1U && lVar3 != -1) {
      if (pValue != (uint32_t *)0x0) {
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,local_48._M_dataplus._M_p + 7,
                   local_48._M_dataplus._M_p + lVar4);
        if (local_60 == 0) {
          uVar2 = 0;
        }
        else {
          lVar3 = atol((char *)local_68);
          uVar2 = (uint32_t)lVar3;
        }
        *pValue = uVar2;
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
      }
      _Var1._M_p = local_48._M_dataplus._M_p;
      bVar6 = true;
      if (pConv != (uint32_t *)0x0) {
        __s = local_48._M_dataplus._M_p + lVar4 + 6;
        local_68 = local_58;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,__s,_Var1._M_p + sVar5 + lVar4 + 6);
        if (local_60 == 0) {
          uVar2 = 0;
        }
        else {
          lVar3 = atol((char *)local_68);
          uVar2 = (uint32_t)lVar3;
        }
        *pConv = uVar2;
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool kcp_grab_syn_and_ack_value(const char* data, uint32_t len, uint32_t* pValue, uint32_t* pConv)
{
	if (pValue) *pValue = 0;
	if (pConv) *pConv = 0;

	std::string str = get_kcp_packet_info(data, len, NET_KCP_SYN_AND_ACK_PACKET);
	if (str.empty())
	{
		return false;
	}

	static const char* valueKey = " value:";
	static const char* convKey = " conv:";

	uint32_t valueKeyLen = strlen(valueKey);
	uint32_t convKeyLen = strlen(convKey);

	auto valuePos = str.find(valueKey);
	auto convPos = str.find(convKey);

	if (valuePos == std::string::npos || convPos == std::string::npos || convPos < valueKeyLen)
	{
		return false;
	}

	if (pValue) *pValue = a2l_safe(std::string(str.c_str() + valueKeyLen, convPos - valueKeyLen));
	if (pConv) *pConv = a2l_safe(std::string(str.c_str() + convPos + convKeyLen));

	return true;
}